

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O3

void mnist_model_build(mnist_model *model)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  ggml_tensor *pgVar4;
  char *pcVar5;
  int extraout_EDX;
  char *pcVar6;
  ggml_context *pgVar7;
  
  iVar1 = std::__cxx11::string::compare((char *)model);
  if (iVar1 == 0) {
    ggml_set_param(model->ctx_compute,model->fc1_weight);
    ggml_set_param(model->ctx_compute,model->fc1_bias);
    ggml_set_param(model->ctx_compute,model->fc2_weight);
    ggml_set_param(model->ctx_compute,model->fc2_bias);
    pgVar7 = model->ctx_compute;
    uVar2 = ggml_mul_mat(pgVar7,model->fc1_weight,model->images);
    uVar2 = ggml_add(pgVar7,uVar2,model->fc1_bias);
    uVar2 = ggml_relu(pgVar7,uVar2);
    pgVar7 = model->ctx_compute;
    uVar2 = ggml_mul_mat(pgVar7,model->fc2_weight,uVar2);
    pgVar4 = model->fc2_bias;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)model);
    if (iVar1 != 0) {
      pcVar5 = "false";
      uVar2 = 0x174;
      goto LAB_00105b1c;
    }
    ggml_set_param(model->ctx_compute,model->conv1_kernel);
    ggml_set_param(model->ctx_compute,model->conv1_bias);
    ggml_set_param(model->ctx_compute,model->conv2_kernel);
    ggml_set_param(model->ctx_compute,model->conv2_bias);
    ggml_set_param(model->ctx_compute,model->dense_weight);
    ggml_set_param(model->ctx_compute,model->dense_bias);
    uVar2 = ggml_reshape_4d(model->ctx_compute,model->images,0x1c,0x1c,1,model->images->ne[1]);
    pgVar7 = model->ctx_compute;
    uVar2 = ggml_conv_2d(pgVar7,model->conv1_kernel,uVar2,1,1,1,1,1,1);
    uVar2 = ggml_add(pgVar7,uVar2,model->conv1_bias);
    lVar3 = ggml_relu(pgVar7,uVar2);
    if (*(long *)(lVar3 + 0x10) != 0x1c) {
      pcVar5 = "conv1_out->ne[0] == MNIST_HW";
      uVar2 = 0x151;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x18) != 0x1c) {
      pcVar5 = "conv1_out->ne[1] == MNIST_HW";
      uVar2 = 0x152;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x20) != 8) {
      pcVar5 = "conv1_out->ne[2] == MNIST_CNN_NCB";
      uVar2 = 0x153;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x28) != (long)model->nbatch_physical) {
      pcVar5 = "conv1_out->ne[3] == model.nbatch_physical";
      uVar2 = 0x154;
      goto LAB_00105b1c;
    }
    lVar3 = ggml_pool_2d(0,0,model->ctx_compute,lVar3,0,2,2,2,2);
    if (*(long *)(lVar3 + 0x10) != 0xe) {
      pcVar5 = "conv2_in->ne[0] == MNIST_HW/2";
      uVar2 = 0x157;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x18) != 0xe) {
      pcVar5 = "conv2_in->ne[1] == MNIST_HW/2";
      uVar2 = 0x158;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x20) != 8) {
      pcVar5 = "conv2_in->ne[2] == MNIST_CNN_NCB";
      uVar2 = 0x159;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x28) != (long)model->nbatch_physical) {
      pcVar5 = "conv2_in->ne[3] == model.nbatch_physical";
      uVar2 = 0x15a;
      goto LAB_00105b1c;
    }
    pgVar7 = model->ctx_compute;
    uVar2 = ggml_conv_2d(pgVar7,model->conv2_kernel,lVar3,1,1,1,1,1,1);
    uVar2 = ggml_add(pgVar7,uVar2,model->conv2_bias);
    lVar3 = ggml_relu(pgVar7,uVar2);
    if (*(long *)(lVar3 + 0x10) != 0xe) {
      pcVar5 = "conv2_out->ne[0] == MNIST_HW/2";
      uVar2 = 0x15f;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x18) != 0xe) {
      pcVar5 = "conv2_out->ne[1] == MNIST_HW/2";
      uVar2 = 0x160;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x20) != 0x10) {
      pcVar5 = "conv2_out->ne[2] == MNIST_CNN_NCB*2";
      uVar2 = 0x161;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x28) != (long)model->nbatch_physical) {
      pcVar5 = "conv2_out->ne[3] == model.nbatch_physical";
      uVar2 = 0x162;
      goto LAB_00105b1c;
    }
    lVar3 = ggml_pool_2d(0,0,model->ctx_compute,lVar3,0,2,2,2,2);
    if (*(long *)(lVar3 + 0x10) != 7) {
      pcVar5 = "dense_in->ne[0] == MNIST_HW/4";
      uVar2 = 0x165;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x18) != 7) {
      pcVar5 = "dense_in->ne[1] == MNIST_HW/4";
      uVar2 = 0x166;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x20) != 0x10) {
      pcVar5 = "dense_in->ne[2] == MNIST_CNN_NCB*2";
      uVar2 = 0x167;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x28) != (long)model->nbatch_physical) {
      pcVar5 = "dense_in->ne[3] == model.nbatch_physical";
      uVar2 = 0x168;
      goto LAB_00105b1c;
    }
    pgVar7 = model->ctx_compute;
    uVar2 = ggml_permute(pgVar7,lVar3,1,2,0,3);
    uVar2 = ggml_cont(pgVar7,uVar2);
    lVar3 = ggml_reshape_2d(pgVar7,uVar2,0x310,(long)model->nbatch_physical);
    if (*(long *)(lVar3 + 0x10) != 0x310) {
      pcVar5 = "dense_in->ne[0] == (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2)";
      uVar2 = 0x16d;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x18) != (long)model->nbatch_physical) {
      pcVar5 = "dense_in->ne[1] == model.nbatch_physical";
      uVar2 = 0x16e;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x20) != 1) {
      pcVar5 = "dense_in->ne[2] == 1";
      uVar2 = 0x16f;
      goto LAB_00105b1c;
    }
    if (*(long *)(lVar3 + 0x28) != 1) {
      pcVar5 = "dense_in->ne[3] == 1";
      uVar2 = 0x170;
      goto LAB_00105b1c;
    }
    pgVar7 = model->ctx_compute;
    uVar2 = ggml_mul_mat(pgVar7,model->dense_weight,lVar3);
    pgVar4 = model->dense_bias;
  }
  pgVar4 = (ggml_tensor *)ggml_add(pgVar7,uVar2,pgVar4);
  model->logits = pgVar4;
  ggml_set_name(pgVar4,"logits");
  ggml_set_output(model->logits);
  pgVar4 = model->logits;
  if (pgVar4->type == GGML_TYPE_F32) {
    if (pgVar4->ne[0] == 10) {
      if (pgVar4->ne[1] == (long)model->nbatch_physical) {
        if (pgVar4->ne[2] == 1) {
          if (pgVar4->ne[3] == 1) {
            return;
          }
          pcVar5 = "model.logits->ne[3] == 1";
          uVar2 = 0x17d;
        }
        else {
          pcVar5 = "model.logits->ne[2] == 1";
          uVar2 = 0x17c;
        }
      }
      else {
        pcVar5 = "model.logits->ne[1] == model.nbatch_physical";
        uVar2 = 0x17b;
      }
    }
    else {
      pcVar5 = "model.logits->ne[0] == MNIST_NCLASSES";
      uVar2 = 0x17a;
    }
  }
  else {
    pcVar5 = "model.logits->type == GGML_TYPE_F32";
    uVar2 = 0x179;
  }
LAB_00105b1c:
  pcVar6 = 
  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
  ;
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
             ,uVar2,"GGML_ASSERT(%s) failed",pcVar5);
  ggml_opt_fit(*(undefined8 *)(pcVar6 + 0x20),*(undefined8 *)(pcVar6 + 0xb8),
               *(undefined8 *)(pcVar6 + 0x48),*(undefined8 *)(pcVar6 + 0x50),uVar2,2,
               ggml_opt_get_default_optimizer_params,(long)extraout_EDX,
               (long)*(int *)(pcVar6 + 0x40),0,model);
  return;
}

Assistant:

void mnist_model_build(mnist_model & model) {
    if (model.arch == "mnist-fc") {
        ggml_set_param(model.ctx_compute, model.fc1_weight);
        ggml_set_param(model.ctx_compute, model.fc1_bias);
        ggml_set_param(model.ctx_compute, model.fc2_weight);
        ggml_set_param(model.ctx_compute, model.fc2_bias);

        ggml_tensor * fc1 = ggml_relu(model.ctx_compute, ggml_add(model.ctx_compute,
            ggml_mul_mat(model.ctx_compute, model.fc1_weight, model.images),
            model.fc1_bias));
        model.logits = ggml_add(model.ctx_compute,
            ggml_mul_mat(model.ctx_compute, model.fc2_weight, fc1),
            model.fc2_bias);
    } else if (model.arch == "mnist-cnn") {
        ggml_set_param(model.ctx_compute, model.conv1_kernel);
        ggml_set_param(model.ctx_compute, model.conv1_bias);
        ggml_set_param(model.ctx_compute, model.conv2_kernel);
        ggml_set_param(model.ctx_compute, model.conv2_bias);
        ggml_set_param(model.ctx_compute, model.dense_weight);
        ggml_set_param(model.ctx_compute, model.dense_bias);

        struct ggml_tensor * images_2D = ggml_reshape_4d(model.ctx_compute, model.images, MNIST_HW, MNIST_HW, 1, model.images->ne[1]);

        struct ggml_tensor * conv1_out = ggml_relu(model.ctx_compute, ggml_add(model.ctx_compute,
            ggml_conv_2d(model.ctx_compute, model.conv1_kernel, images_2D, 1, 1, 1, 1, 1, 1),
            model.conv1_bias));
        GGML_ASSERT(conv1_out->ne[0] == MNIST_HW);
        GGML_ASSERT(conv1_out->ne[1] == MNIST_HW);
        GGML_ASSERT(conv1_out->ne[2] == MNIST_CNN_NCB);
        GGML_ASSERT(conv1_out->ne[3] == model.nbatch_physical);

        struct ggml_tensor * conv2_in = ggml_pool_2d(model.ctx_compute, conv1_out, GGML_OP_POOL_MAX, 2, 2, 2, 2, 0, 0);
        GGML_ASSERT(conv2_in->ne[0] == MNIST_HW/2);
        GGML_ASSERT(conv2_in->ne[1] == MNIST_HW/2);
        GGML_ASSERT(conv2_in->ne[2] == MNIST_CNN_NCB);
        GGML_ASSERT(conv2_in->ne[3] == model.nbatch_physical);

        struct ggml_tensor * conv2_out = ggml_relu(model.ctx_compute, ggml_add(model.ctx_compute,
            ggml_conv_2d(model.ctx_compute, model.conv2_kernel, conv2_in, 1, 1, 1, 1, 1, 1),
            model.conv2_bias));
        GGML_ASSERT(conv2_out->ne[0] == MNIST_HW/2);
        GGML_ASSERT(conv2_out->ne[1] == MNIST_HW/2);
        GGML_ASSERT(conv2_out->ne[2] == MNIST_CNN_NCB*2);
        GGML_ASSERT(conv2_out->ne[3] == model.nbatch_physical);

        struct ggml_tensor * dense_in = ggml_pool_2d(model.ctx_compute, conv2_out, GGML_OP_POOL_MAX, 2, 2, 2, 2, 0, 0);
        GGML_ASSERT(dense_in->ne[0] == MNIST_HW/4);
        GGML_ASSERT(dense_in->ne[1] == MNIST_HW/4);
        GGML_ASSERT(dense_in->ne[2] == MNIST_CNN_NCB*2);
        GGML_ASSERT(dense_in->ne[3] == model.nbatch_physical);

        dense_in = ggml_reshape_2d(model.ctx_compute,
            ggml_cont(model.ctx_compute, ggml_permute(model.ctx_compute, dense_in, 1, 2, 0, 3)),
            (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2), model.nbatch_physical);
        GGML_ASSERT(dense_in->ne[0] == (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2));
        GGML_ASSERT(dense_in->ne[1] == model.nbatch_physical);
        GGML_ASSERT(dense_in->ne[2] == 1);
        GGML_ASSERT(dense_in->ne[3] == 1);

        model.logits = ggml_add(model.ctx_compute, ggml_mul_mat(model.ctx_compute, model.dense_weight, dense_in), model.dense_bias);
    } else {
        GGML_ASSERT(false);
    }

    ggml_set_name(model.logits, "logits");
    ggml_set_output(model.logits);
    GGML_ASSERT(model.logits->type == GGML_TYPE_F32);
    GGML_ASSERT(model.logits->ne[0] == MNIST_NCLASSES);
    GGML_ASSERT(model.logits->ne[1] == model.nbatch_physical);
    GGML_ASSERT(model.logits->ne[2] == 1);
    GGML_ASSERT(model.logits->ne[3] == 1);
}